

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O0

size_t __thiscall
Assimp::IFC::anon_unknown_9::Conic::EstimateSampleCount(Conic *this,IfcFloat a,IfcFloat b)

{
  float fVar1;
  bool bVar2;
  ulong uVar3;
  int __x;
  Conic *pCVar4;
  double __x_00;
  double dVar5;
  IfcFloat setting;
  IfcFloat b_local;
  IfcFloat a_local;
  Conic *this_local;
  
  bVar2 = Curve::InRange(&this->super_Curve,a);
  if (!bVar2) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x50,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::Conic::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  pCVar4 = this;
  bVar2 = Curve::InRange(&this->super_Curve,b);
  __x = (int)pCVar4;
  if (!bVar2) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x51,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::Conic::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  dVar5 = ((this->super_Curve).conv)->angle_scale;
  fmod(a * ((this->super_Curve).conv)->angle_scale,6.283185307179586);
  fmod(b * dVar5,6.283185307179586);
  fVar1 = ((this->super_Curve).conv)->settings->conicSamplingAngle;
  std::abs(__x);
  dVar5 = ceil(__x_00);
  dVar5 = dVar5 / (((double)fVar1 * 3.141592653589793) / 180.0);
  uVar3 = (ulong)dVar5;
  return uVar3 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f;
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );

        a *= conv.angle_scale;
        b *= conv.angle_scale;

        a = std::fmod(a,static_cast<IfcFloat>( AI_MATH_TWO_PI ));
        b = std::fmod(b,static_cast<IfcFloat>( AI_MATH_TWO_PI ));
        const IfcFloat setting = static_cast<IfcFloat>( AI_MATH_PI * conv.settings.conicSamplingAngle / 180.0 );
        return static_cast<size_t>( std::ceil(std::abs( b-a)) / setting);
    }